

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

void fdct64_stage9_avx2(__m256i *x8,__m256i *x9,int32_t *cospi,__m256i *__rounding,int8_t cos_bit)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 (*in_RCX) [32];
  long in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  char in_R8B;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  __m256i in1_w0_7;
  __m256i in0_w1_7;
  __m256i in1_w1_7;
  __m256i in0_w0_7;
  __m256i in1_w0_6;
  __m256i in0_w1_6;
  __m256i in1_w1_6;
  __m256i in0_w0_6;
  __m256i in1_w0_5;
  __m256i in0_w1_5;
  __m256i in1_w1_5;
  __m256i in0_w0_5;
  __m256i in1_w0_4;
  __m256i in0_w1_4;
  __m256i in1_w1_4;
  __m256i in0_w0_4;
  __m256i in1_w0_3;
  __m256i in0_w1_3;
  __m256i in1_w1_3;
  __m256i in0_w0_3;
  __m256i in1_w0_2;
  __m256i in0_w1_2;
  __m256i in1_w1_2;
  __m256i in0_w0_2;
  __m256i in1_w0_1;
  __m256i in0_w1_1;
  __m256i in1_w1_1;
  __m256i in0_w0_1;
  __m256i in1_w0;
  __m256i in0_w1;
  __m256i in1_w1;
  __m256i in0_w0;
  __m256i cospi_p58;
  __m256i cospi_p06;
  __m256i cospi_p26;
  __m256i cospi_p38;
  __m256i cospi_p42;
  __m256i cospi_p22;
  __m256i cospi_p10;
  __m256i cospi_p54;
  __m256i cospi_p50;
  __m256i cospi_p14;
  __m256i cospi_p18;
  __m256i cospi_p46;
  __m256i cospi_p34;
  __m256i cospi_p30;
  __m256i cospi_p02;
  __m256i cospi_p62;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  uVar1 = *(uint *)(in_RDX + 0xf8);
  auVar2 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar2 = vpinsrd_avx(auVar2,uVar1,2);
  auVar2 = vpinsrd_avx(auVar2,uVar1,3);
  auVar3 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar3 = vpinsrd_avx(auVar3,uVar1,2);
  auVar3 = vpinsrd_avx(auVar3,uVar1,3);
  uStack_430 = auVar3._0_8_;
  uStack_428 = auVar3._8_8_;
  uVar1 = *(uint *)(in_RDX + 8);
  auVar3 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar3 = vpinsrd_avx(auVar3,uVar1,2);
  auVar3 = vpinsrd_avx(auVar3,uVar1,3);
  auVar4 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar4 = vpinsrd_avx(auVar4,uVar1,2);
  auVar4 = vpinsrd_avx(auVar4,uVar1,3);
  uStack_3f0 = auVar4._0_8_;
  uStack_3e8 = auVar4._8_8_;
  uVar1 = *(uint *)(in_RDX + 0x78);
  auVar4 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar4 = vpinsrd_avx(auVar4,uVar1,2);
  auVar4 = vpinsrd_avx(auVar4,uVar1,3);
  auVar5 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar5 = vpinsrd_avx(auVar5,uVar1,2);
  auVar5 = vpinsrd_avx(auVar5,uVar1,3);
  uStack_3b0 = auVar5._0_8_;
  uStack_3a8 = auVar5._8_8_;
  uVar1 = *(uint *)(in_RDX + 0x88);
  auVar5 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar5 = vpinsrd_avx(auVar5,uVar1,2);
  auVar5 = vpinsrd_avx(auVar5,uVar1,3);
  auVar6 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar6 = vpinsrd_avx(auVar6,uVar1,2);
  auVar6 = vpinsrd_avx(auVar6,uVar1,3);
  uStack_370 = auVar6._0_8_;
  uStack_368 = auVar6._8_8_;
  uVar1 = *(uint *)(in_RDX + 0xb8);
  auVar6 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar6 = vpinsrd_avx(auVar6,uVar1,2);
  auVar6 = vpinsrd_avx(auVar6,uVar1,3);
  auVar7 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar7 = vpinsrd_avx(auVar7,uVar1,2);
  auVar7 = vpinsrd_avx(auVar7,uVar1,3);
  uStack_330 = auVar7._0_8_;
  uStack_328 = auVar7._8_8_;
  uVar1 = *(uint *)(in_RDX + 0x48);
  auVar7 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar7 = vpinsrd_avx(auVar7,uVar1,2);
  auVar7 = vpinsrd_avx(auVar7,uVar1,3);
  auVar8 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar8 = vpinsrd_avx(auVar8,uVar1,2);
  auVar8 = vpinsrd_avx(auVar8,uVar1,3);
  uStack_2f0 = auVar8._0_8_;
  uStack_2e8 = auVar8._8_8_;
  uVar1 = *(uint *)(in_RDX + 0x38);
  auVar8 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar8 = vpinsrd_avx(auVar8,uVar1,2);
  auVar8 = vpinsrd_avx(auVar8,uVar1,3);
  auVar9 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar9 = vpinsrd_avx(auVar9,uVar1,2);
  auVar9 = vpinsrd_avx(auVar9,uVar1,3);
  uStack_2b0 = auVar9._0_8_;
  uStack_2a8 = auVar9._8_8_;
  uVar1 = *(uint *)(in_RDX + 200);
  auVar9 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar9 = vpinsrd_avx(auVar9,uVar1,2);
  auVar9 = vpinsrd_avx(auVar9,uVar1,3);
  auVar10 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar10 = vpinsrd_avx(auVar10,uVar1,2);
  auVar10 = vpinsrd_avx(auVar10,uVar1,3);
  uStack_270 = auVar10._0_8_;
  uStack_268 = auVar10._8_8_;
  uVar1 = *(uint *)(in_RDX + 0xd8);
  auVar10 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar10 = vpinsrd_avx(auVar10,uVar1,2);
  auVar10 = vpinsrd_avx(auVar10,uVar1,3);
  auVar11 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar11 = vpinsrd_avx(auVar11,uVar1,2);
  auVar11 = vpinsrd_avx(auVar11,uVar1,3);
  uStack_230 = auVar11._0_8_;
  uStack_228 = auVar11._8_8_;
  uVar1 = *(uint *)(in_RDX + 0x28);
  auVar11 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar11 = vpinsrd_avx(auVar11,uVar1,2);
  auVar11 = vpinsrd_avx(auVar11,uVar1,3);
  auVar12 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar12 = vpinsrd_avx(auVar12,uVar1,2);
  auVar12 = vpinsrd_avx(auVar12,uVar1,3);
  uStack_1f0 = auVar12._0_8_;
  uStack_1e8 = auVar12._8_8_;
  uVar1 = *(uint *)(in_RDX + 0x58);
  auVar12 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar12 = vpinsrd_avx(auVar12,uVar1,2);
  auVar12 = vpinsrd_avx(auVar12,uVar1,3);
  auVar13 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar13 = vpinsrd_avx(auVar13,uVar1,2);
  auVar13 = vpinsrd_avx(auVar13,uVar1,3);
  uStack_1b0 = auVar13._0_8_;
  uStack_1a8 = auVar13._8_8_;
  uVar1 = *(uint *)(in_RDX + 0xa8);
  auVar13 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar13 = vpinsrd_avx(auVar13,uVar1,2);
  auVar13 = vpinsrd_avx(auVar13,uVar1,3);
  auVar14 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar14 = vpinsrd_avx(auVar14,uVar1,2);
  auVar14 = vpinsrd_avx(auVar14,uVar1,3);
  uStack_170 = auVar14._0_8_;
  uStack_168 = auVar14._8_8_;
  uVar1 = *(uint *)(in_RDX + 0x98);
  auVar14 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar14 = vpinsrd_avx(auVar14,uVar1,2);
  auVar14 = vpinsrd_avx(auVar14,uVar1,3);
  auVar15 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar15 = vpinsrd_avx(auVar15,uVar1,2);
  auVar15 = vpinsrd_avx(auVar15,uVar1,3);
  uStack_130 = auVar15._0_8_;
  uStack_128 = auVar15._8_8_;
  uVar1 = *(uint *)(in_RDX + 0x68);
  auVar15 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar15 = vpinsrd_avx(auVar15,uVar1,2);
  auVar15 = vpinsrd_avx(auVar15,uVar1,3);
  auVar16 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar16 = vpinsrd_avx(auVar16,uVar1,2);
  auVar16 = vpinsrd_avx(auVar16,uVar1,3);
  uStack_f0 = auVar16._0_8_;
  uStack_e8 = auVar16._8_8_;
  uVar1 = *(uint *)(in_RDX + 0x18);
  auVar16 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar16 = vpinsrd_avx(auVar16,uVar1,2);
  auVar16 = vpinsrd_avx(auVar16,uVar1,3);
  auVar53 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar53 = vpinsrd_avx(auVar53,uVar1,2);
  auVar53 = vpinsrd_avx(auVar53,uVar1,3);
  uStack_b0 = auVar53._0_8_;
  uStack_a8 = auVar53._8_8_;
  uVar1 = *(uint *)(in_RDX + 0xe8);
  auVar53 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar53 = vpinsrd_avx(auVar53,uVar1,2);
  auVar53 = vpinsrd_avx(auVar53,uVar1,3);
  auVar52 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar52 = vpinsrd_avx(auVar52,uVar1,2);
  auVar52 = vpinsrd_avx(auVar52,uVar1,3);
  auVar52 = ZEXT116(0) * auVar53 + ZEXT116(1) * auVar52;
  auVar53 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar53;
  uStack_70 = auVar53._0_8_;
  uStack_68 = auVar53._8_8_;
  uVar19 = in_RDI[1];
  uVar20 = in_RDI[2];
  uVar21 = in_RDI[3];
  *in_RSI = *in_RDI;
  in_RSI[1] = uVar19;
  in_RSI[2] = uVar20;
  in_RSI[3] = uVar21;
  uVar19 = in_RDI[5];
  uVar20 = in_RDI[6];
  uVar21 = in_RDI[7];
  in_RSI[4] = in_RDI[4];
  in_RSI[5] = uVar19;
  in_RSI[6] = uVar20;
  in_RSI[7] = uVar21;
  uVar19 = in_RDI[9];
  uVar20 = in_RDI[10];
  uVar21 = in_RDI[0xb];
  in_RSI[8] = in_RDI[8];
  in_RSI[9] = uVar19;
  in_RSI[10] = uVar20;
  in_RSI[0xb] = uVar21;
  uVar19 = in_RDI[0xd];
  uVar20 = in_RDI[0xe];
  uVar21 = in_RDI[0xf];
  in_RSI[0xc] = in_RDI[0xc];
  in_RSI[0xd] = uVar19;
  in_RSI[0xe] = uVar20;
  in_RSI[0xf] = uVar21;
  uVar19 = in_RDI[0x11];
  uVar20 = in_RDI[0x12];
  uVar21 = in_RDI[0x13];
  in_RSI[0x10] = in_RDI[0x10];
  in_RSI[0x11] = uVar19;
  in_RSI[0x12] = uVar20;
  in_RSI[0x13] = uVar21;
  uVar19 = in_RDI[0x15];
  uVar20 = in_RDI[0x16];
  uVar21 = in_RDI[0x17];
  in_RSI[0x14] = in_RDI[0x14];
  in_RSI[0x15] = uVar19;
  in_RSI[0x16] = uVar20;
  in_RSI[0x17] = uVar21;
  uVar19 = in_RDI[0x19];
  uVar20 = in_RDI[0x1a];
  uVar21 = in_RDI[0x1b];
  in_RSI[0x18] = in_RDI[0x18];
  in_RSI[0x19] = uVar19;
  in_RSI[0x1a] = uVar20;
  in_RSI[0x1b] = uVar21;
  uVar19 = in_RDI[0x1d];
  uVar20 = in_RDI[0x1e];
  uVar21 = in_RDI[0x1f];
  in_RSI[0x1c] = in_RDI[0x1c];
  in_RSI[0x1d] = uVar19;
  in_RSI[0x1e] = uVar20;
  in_RSI[0x1f] = uVar21;
  uVar19 = in_RDI[0x21];
  uVar20 = in_RDI[0x22];
  uVar21 = in_RDI[0x23];
  in_RSI[0x20] = in_RDI[0x20];
  in_RSI[0x21] = uVar19;
  in_RSI[0x22] = uVar20;
  in_RSI[0x23] = uVar21;
  uVar19 = in_RDI[0x25];
  uVar20 = in_RDI[0x26];
  uVar21 = in_RDI[0x27];
  in_RSI[0x24] = in_RDI[0x24];
  in_RSI[0x25] = uVar19;
  in_RSI[0x26] = uVar20;
  in_RSI[0x27] = uVar21;
  uVar19 = in_RDI[0x29];
  uVar20 = in_RDI[0x2a];
  uVar21 = in_RDI[0x2b];
  in_RSI[0x28] = in_RDI[0x28];
  in_RSI[0x29] = uVar19;
  in_RSI[0x2a] = uVar20;
  in_RSI[0x2b] = uVar21;
  uVar19 = in_RDI[0x2d];
  uVar20 = in_RDI[0x2e];
  uVar21 = in_RDI[0x2f];
  in_RSI[0x2c] = in_RDI[0x2c];
  in_RSI[0x2d] = uVar19;
  in_RSI[0x2e] = uVar20;
  in_RSI[0x2f] = uVar21;
  uVar19 = in_RDI[0x31];
  uVar20 = in_RDI[0x32];
  uVar21 = in_RDI[0x33];
  in_RSI[0x30] = in_RDI[0x30];
  in_RSI[0x31] = uVar19;
  in_RSI[0x32] = uVar20;
  in_RSI[0x33] = uVar21;
  uVar19 = in_RDI[0x35];
  uVar20 = in_RDI[0x36];
  uVar21 = in_RDI[0x37];
  in_RSI[0x34] = in_RDI[0x34];
  in_RSI[0x35] = uVar19;
  in_RSI[0x36] = uVar20;
  in_RSI[0x37] = uVar21;
  uVar19 = in_RDI[0x39];
  uVar20 = in_RDI[0x3a];
  uVar21 = in_RDI[0x3b];
  in_RSI[0x38] = in_RDI[0x38];
  in_RSI[0x39] = uVar19;
  in_RSI[0x3a] = uVar20;
  in_RSI[0x3b] = uVar21;
  uVar19 = in_RDI[0x3d];
  uVar20 = in_RDI[0x3e];
  uVar21 = in_RDI[0x3f];
  in_RSI[0x3c] = in_RDI[0x3c];
  in_RSI[0x3d] = uVar19;
  in_RSI[0x3e] = uVar20;
  in_RSI[0x3f] = uVar21;
  auVar51._16_8_ = uStack_3f0;
  auVar51._0_16_ = auVar3;
  auVar51._24_8_ = uStack_3e8;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x7c),auVar51);
  auVar50._16_8_ = uStack_430;
  auVar50._0_16_ = auVar2;
  auVar50._24_8_ = uStack_428;
  auVar18 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x40),auVar50);
  auVar17 = vpaddd_avx2(auVar17,auVar18);
  *(undefined1 (*) [32])(in_RSI + 0x40) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x40),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x40) = auVar17;
  auVar17 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x40),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x40) = auVar17;
  auVar49._16_8_ = uStack_430;
  auVar49._0_16_ = auVar2;
  auVar49._24_8_ = uStack_428;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x7c),auVar49);
  auVar48._16_8_ = uStack_3f0;
  auVar48._0_16_ = auVar3;
  auVar48._24_8_ = uStack_3e8;
  auVar18 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x40),auVar48);
  auVar17 = vpsubd_avx2(auVar17,auVar18);
  *(undefined1 (*) [32])(in_RSI + 0x7c) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x7c),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x7c) = auVar17;
  auVar17 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x7c),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x7c) = auVar17;
  auVar47._16_8_ = uStack_370;
  auVar47._0_16_ = auVar5;
  auVar47._24_8_ = uStack_368;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x78),auVar47);
  auVar46._16_8_ = uStack_3b0;
  auVar46._0_16_ = auVar4;
  auVar46._24_8_ = uStack_3a8;
  auVar18 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x44),auVar46);
  auVar17 = vpaddd_avx2(auVar17,auVar18);
  *(undefined1 (*) [32])(in_RSI + 0x44) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x44),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x44) = auVar17;
  auVar17 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x44),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x44) = auVar17;
  auVar45._16_8_ = uStack_3b0;
  auVar45._0_16_ = auVar4;
  auVar45._24_8_ = uStack_3a8;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x78),auVar45);
  auVar44._16_8_ = uStack_370;
  auVar44._0_16_ = auVar5;
  auVar44._24_8_ = uStack_368;
  auVar18 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x44),auVar44);
  auVar17 = vpsubd_avx2(auVar17,auVar18);
  *(undefined1 (*) [32])(in_RSI + 0x78) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x78),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x78) = auVar17;
  auVar17 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x78),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x78) = auVar17;
  auVar43._16_8_ = uStack_2f0;
  auVar43._0_16_ = auVar7;
  auVar43._24_8_ = uStack_2e8;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x74),auVar43);
  auVar42._16_8_ = uStack_330;
  auVar42._0_16_ = auVar6;
  auVar42._24_8_ = uStack_328;
  auVar18 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x48),auVar42);
  auVar17 = vpaddd_avx2(auVar17,auVar18);
  *(undefined1 (*) [32])(in_RSI + 0x48) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x48),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x48) = auVar17;
  auVar17 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x48),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x48) = auVar17;
  auVar41._16_8_ = uStack_330;
  auVar41._0_16_ = auVar6;
  auVar41._24_8_ = uStack_328;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x74),auVar41);
  auVar40._16_8_ = uStack_2f0;
  auVar40._0_16_ = auVar7;
  auVar40._24_8_ = uStack_2e8;
  auVar18 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x48),auVar40);
  auVar17 = vpsubd_avx2(auVar17,auVar18);
  *(undefined1 (*) [32])(in_RSI + 0x74) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x74),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x74) = auVar17;
  auVar17 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x74),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x74) = auVar17;
  auVar39._16_8_ = uStack_270;
  auVar39._0_16_ = auVar9;
  auVar39._24_8_ = uStack_268;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x70),auVar39);
  auVar38._16_8_ = uStack_2b0;
  auVar38._0_16_ = auVar8;
  auVar38._24_8_ = uStack_2a8;
  auVar18 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x4c),auVar38);
  auVar17 = vpaddd_avx2(auVar17,auVar18);
  *(undefined1 (*) [32])(in_RSI + 0x4c) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x4c),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x4c) = auVar17;
  auVar17 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x4c),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x4c) = auVar17;
  auVar37._16_8_ = uStack_2b0;
  auVar37._0_16_ = auVar8;
  auVar37._24_8_ = uStack_2a8;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x70),auVar37);
  auVar36._16_8_ = uStack_270;
  auVar36._0_16_ = auVar9;
  auVar36._24_8_ = uStack_268;
  auVar18 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x4c),auVar36);
  auVar17 = vpsubd_avx2(auVar17,auVar18);
  *(undefined1 (*) [32])(in_RSI + 0x70) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x70),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x70) = auVar17;
  auVar17 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x70),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x70) = auVar17;
  auVar35._16_8_ = uStack_1f0;
  auVar35._0_16_ = auVar11;
  auVar35._24_8_ = uStack_1e8;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x6c),auVar35);
  auVar34._16_8_ = uStack_230;
  auVar34._0_16_ = auVar10;
  auVar34._24_8_ = uStack_228;
  auVar18 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x50),auVar34);
  auVar17 = vpaddd_avx2(auVar17,auVar18);
  *(undefined1 (*) [32])(in_RSI + 0x50) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x50),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x50) = auVar17;
  auVar17 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x50),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x50) = auVar17;
  auVar33._16_8_ = uStack_230;
  auVar33._0_16_ = auVar10;
  auVar33._24_8_ = uStack_228;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x6c),auVar33);
  auVar32._16_8_ = uStack_1f0;
  auVar32._0_16_ = auVar11;
  auVar32._24_8_ = uStack_1e8;
  auVar18 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x50),auVar32);
  auVar17 = vpsubd_avx2(auVar17,auVar18);
  *(undefined1 (*) [32])(in_RSI + 0x6c) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x6c),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x6c) = auVar17;
  auVar17 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x6c),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x6c) = auVar17;
  auVar31._16_8_ = uStack_170;
  auVar31._0_16_ = auVar13;
  auVar31._24_8_ = uStack_168;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x68),auVar31);
  auVar30._16_8_ = uStack_1b0;
  auVar30._0_16_ = auVar12;
  auVar30._24_8_ = uStack_1a8;
  auVar18 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x54),auVar30);
  auVar17 = vpaddd_avx2(auVar17,auVar18);
  *(undefined1 (*) [32])(in_RSI + 0x54) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x54),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x54) = auVar17;
  auVar17 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x54),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x54) = auVar17;
  auVar29._16_8_ = uStack_1b0;
  auVar29._0_16_ = auVar12;
  auVar29._24_8_ = uStack_1a8;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x68),auVar29);
  auVar28._16_8_ = uStack_170;
  auVar28._0_16_ = auVar13;
  auVar28._24_8_ = uStack_168;
  auVar18 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x54),auVar28);
  auVar17 = vpsubd_avx2(auVar17,auVar18);
  *(undefined1 (*) [32])(in_RSI + 0x68) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x68),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x68) = auVar17;
  auVar17 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x68),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x68) = auVar17;
  auVar27._16_8_ = uStack_f0;
  auVar27._0_16_ = auVar15;
  auVar27._24_8_ = uStack_e8;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 100),auVar27);
  auVar26._16_8_ = uStack_130;
  auVar26._0_16_ = auVar14;
  auVar26._24_8_ = uStack_128;
  auVar18 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x58),auVar26);
  auVar17 = vpaddd_avx2(auVar17,auVar18);
  *(undefined1 (*) [32])(in_RSI + 0x58) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x58),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x58) = auVar17;
  auVar17 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x58),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x58) = auVar17;
  auVar25._16_8_ = uStack_130;
  auVar25._0_16_ = auVar14;
  auVar25._24_8_ = uStack_128;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 100),auVar25);
  auVar24._16_8_ = uStack_f0;
  auVar24._0_16_ = auVar15;
  auVar24._24_8_ = uStack_e8;
  auVar18 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x58),auVar24);
  auVar17 = vpsubd_avx2(auVar17,auVar18);
  *(undefined1 (*) [32])(in_RSI + 100) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 100),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 100) = auVar17;
  auVar17 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 100),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 100) = auVar17;
  auVar23._16_8_ = uStack_70;
  auVar23._0_16_ = auVar52;
  auVar23._24_8_ = uStack_68;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x60),auVar23);
  auVar22._16_8_ = uStack_b0;
  auVar22._0_16_ = auVar16;
  auVar22._24_8_ = uStack_a8;
  auVar18 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x5c),auVar22);
  auVar17 = vpaddd_avx2(auVar17,auVar18);
  *(undefined1 (*) [32])(in_RSI + 0x5c) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x5c),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x5c) = auVar17;
  auVar17 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x5c),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x5c) = auVar17;
  auVar17._16_8_ = uStack_b0;
  auVar17._0_16_ = auVar16;
  auVar17._24_8_ = uStack_a8;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x60),auVar17);
  auVar18._16_8_ = uStack_70;
  auVar18._0_16_ = auVar52;
  auVar18._24_8_ = uStack_68;
  auVar18 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x5c),auVar18);
  auVar17 = vpsubd_avx2(auVar17,auVar18);
  *(undefined1 (*) [32])(in_RSI + 0x60) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x60),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x60) = auVar17;
  auVar17 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x60),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x60) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0x80),*(undefined1 (*) [32])(in_RDI + 0x84))
  ;
  *(undefined1 (*) [32])(in_RSI + 0x80) = auVar17;
  auVar17 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0x80),*(undefined1 (*) [32])(in_RDI + 0x84))
  ;
  *(undefined1 (*) [32])(in_RSI + 0x84) = auVar17;
  auVar17 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0x8c),*(undefined1 (*) [32])(in_RDI + 0x88))
  ;
  *(undefined1 (*) [32])(in_RSI + 0x88) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0x8c),*(undefined1 (*) [32])(in_RDI + 0x88))
  ;
  *(undefined1 (*) [32])(in_RSI + 0x8c) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0x90),*(undefined1 (*) [32])(in_RDI + 0x94))
  ;
  *(undefined1 (*) [32])(in_RSI + 0x90) = auVar17;
  auVar17 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0x90),*(undefined1 (*) [32])(in_RDI + 0x94))
  ;
  *(undefined1 (*) [32])(in_RSI + 0x94) = auVar17;
  auVar17 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0x9c),*(undefined1 (*) [32])(in_RDI + 0x98))
  ;
  *(undefined1 (*) [32])(in_RSI + 0x98) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0x9c),*(undefined1 (*) [32])(in_RDI + 0x98))
  ;
  *(undefined1 (*) [32])(in_RSI + 0x9c) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0xa0),*(undefined1 (*) [32])(in_RDI + 0xa4))
  ;
  *(undefined1 (*) [32])(in_RSI + 0xa0) = auVar17;
  auVar17 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0xa0),*(undefined1 (*) [32])(in_RDI + 0xa4))
  ;
  *(undefined1 (*) [32])(in_RSI + 0xa4) = auVar17;
  auVar17 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0xac),*(undefined1 (*) [32])(in_RDI + 0xa8))
  ;
  *(undefined1 (*) [32])(in_RSI + 0xa8) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0xac),*(undefined1 (*) [32])(in_RDI + 0xa8))
  ;
  *(undefined1 (*) [32])(in_RSI + 0xac) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0xb0),*(undefined1 (*) [32])(in_RDI + 0xb4))
  ;
  *(undefined1 (*) [32])(in_RSI + 0xb0) = auVar17;
  auVar17 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0xb0),*(undefined1 (*) [32])(in_RDI + 0xb4))
  ;
  *(undefined1 (*) [32])(in_RSI + 0xb4) = auVar17;
  auVar17 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0xbc),*(undefined1 (*) [32])(in_RDI + 0xb8))
  ;
  *(undefined1 (*) [32])(in_RSI + 0xb8) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0xbc),*(undefined1 (*) [32])(in_RDI + 0xb8))
  ;
  *(undefined1 (*) [32])(in_RSI + 0xbc) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0xc0),*(undefined1 (*) [32])(in_RDI + 0xc4))
  ;
  *(undefined1 (*) [32])(in_RSI + 0xc0) = auVar17;
  auVar17 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0xc0),*(undefined1 (*) [32])(in_RDI + 0xc4))
  ;
  *(undefined1 (*) [32])(in_RSI + 0xc4) = auVar17;
  auVar17 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0xcc),*(undefined1 (*) [32])(in_RDI + 200));
  *(undefined1 (*) [32])(in_RSI + 200) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0xcc),*(undefined1 (*) [32])(in_RDI + 200));
  *(undefined1 (*) [32])(in_RSI + 0xcc) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0xd0),*(undefined1 (*) [32])(in_RDI + 0xd4))
  ;
  *(undefined1 (*) [32])(in_RSI + 0xd0) = auVar17;
  auVar17 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0xd0),*(undefined1 (*) [32])(in_RDI + 0xd4))
  ;
  *(undefined1 (*) [32])(in_RSI + 0xd4) = auVar17;
  auVar17 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0xdc),*(undefined1 (*) [32])(in_RDI + 0xd8))
  ;
  *(undefined1 (*) [32])(in_RSI + 0xd8) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0xdc),*(undefined1 (*) [32])(in_RDI + 0xd8))
  ;
  *(undefined1 (*) [32])(in_RSI + 0xdc) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0xe0),*(undefined1 (*) [32])(in_RDI + 0xe4))
  ;
  *(undefined1 (*) [32])(in_RSI + 0xe0) = auVar17;
  auVar17 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0xe0),*(undefined1 (*) [32])(in_RDI + 0xe4))
  ;
  *(undefined1 (*) [32])(in_RSI + 0xe4) = auVar17;
  auVar17 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0xec),*(undefined1 (*) [32])(in_RDI + 0xe8))
  ;
  *(undefined1 (*) [32])(in_RSI + 0xe8) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0xec),*(undefined1 (*) [32])(in_RDI + 0xe8))
  ;
  *(undefined1 (*) [32])(in_RSI + 0xec) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0xf0),*(undefined1 (*) [32])(in_RDI + 0xf4))
  ;
  *(undefined1 (*) [32])(in_RSI + 0xf0) = auVar17;
  auVar17 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0xf0),*(undefined1 (*) [32])(in_RDI + 0xf4))
  ;
  *(undefined1 (*) [32])(in_RSI + 0xf4) = auVar17;
  auVar17 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0xfc),*(undefined1 (*) [32])(in_RDI + 0xf8))
  ;
  *(undefined1 (*) [32])(in_RSI + 0xf8) = auVar17;
  auVar17 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0xfc),*(undefined1 (*) [32])(in_RDI + 0xf8))
  ;
  *(undefined1 (*) [32])(in_RSI + 0xfc) = auVar17;
  return;
}

Assistant:

static inline void fdct64_stage9_avx2(__m256i *x8, __m256i *x9,
                                      const int32_t *cospi,
                                      const __m256i *__rounding,
                                      int8_t cos_bit) {
  __m256i cospi_p62 = _mm256_set1_epi32(cospi[62]);
  __m256i cospi_p02 = _mm256_set1_epi32(cospi[2]);
  __m256i cospi_p30 = _mm256_set1_epi32(cospi[30]);
  __m256i cospi_p34 = _mm256_set1_epi32(cospi[34]);
  __m256i cospi_p46 = _mm256_set1_epi32(cospi[46]);
  __m256i cospi_p18 = _mm256_set1_epi32(cospi[18]);
  __m256i cospi_p14 = _mm256_set1_epi32(cospi[14]);
  __m256i cospi_p50 = _mm256_set1_epi32(cospi[50]);
  __m256i cospi_p54 = _mm256_set1_epi32(cospi[54]);
  __m256i cospi_p10 = _mm256_set1_epi32(cospi[10]);
  __m256i cospi_p22 = _mm256_set1_epi32(cospi[22]);
  __m256i cospi_p42 = _mm256_set1_epi32(cospi[42]);
  __m256i cospi_p38 = _mm256_set1_epi32(cospi[38]);
  __m256i cospi_p26 = _mm256_set1_epi32(cospi[26]);
  __m256i cospi_p06 = _mm256_set1_epi32(cospi[6]);
  __m256i cospi_p58 = _mm256_set1_epi32(cospi[58]);

  x9[0] = x8[0];
  x9[1] = x8[1];
  x9[2] = x8[2];
  x9[3] = x8[3];
  x9[4] = x8[4];
  x9[5] = x8[5];
  x9[6] = x8[6];
  x9[7] = x8[7];
  x9[8] = x8[8];
  x9[9] = x8[9];
  x9[10] = x8[10];
  x9[11] = x8[11];
  x9[12] = x8[12];
  x9[13] = x8[13];
  x9[14] = x8[14];
  x9[15] = x8[15];
  btf_32_type0_avx2_new(cospi_p02, cospi_p62, x8[31], x8[16], x9[16], x9[31],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(cospi_p34, cospi_p30, x8[30], x8[17], x9[17], x9[30],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(cospi_p18, cospi_p46, x8[29], x8[18], x9[18], x9[29],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(cospi_p50, cospi_p14, x8[28], x8[19], x9[19], x9[28],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(cospi_p10, cospi_p54, x8[27], x8[20], x9[20], x9[27],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(cospi_p42, cospi_p22, x8[26], x8[21], x9[21], x9[26],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(cospi_p26, cospi_p38, x8[25], x8[22], x9[22], x9[25],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(cospi_p58, cospi_p06, x8[24], x8[23], x9[23], x9[24],
                        *__rounding, cos_bit);
  x9[32] = _mm256_add_epi32(x8[32], x8[33]);
  x9[33] = _mm256_sub_epi32(x8[32], x8[33]);
  x9[34] = _mm256_sub_epi32(x8[35], x8[34]);
  x9[35] = _mm256_add_epi32(x8[35], x8[34]);
  x9[36] = _mm256_add_epi32(x8[36], x8[37]);
  x9[37] = _mm256_sub_epi32(x8[36], x8[37]);
  x9[38] = _mm256_sub_epi32(x8[39], x8[38]);
  x9[39] = _mm256_add_epi32(x8[39], x8[38]);
  x9[40] = _mm256_add_epi32(x8[40], x8[41]);
  x9[41] = _mm256_sub_epi32(x8[40], x8[41]);
  x9[42] = _mm256_sub_epi32(x8[43], x8[42]);
  x9[43] = _mm256_add_epi32(x8[43], x8[42]);
  x9[44] = _mm256_add_epi32(x8[44], x8[45]);
  x9[45] = _mm256_sub_epi32(x8[44], x8[45]);
  x9[46] = _mm256_sub_epi32(x8[47], x8[46]);
  x9[47] = _mm256_add_epi32(x8[47], x8[46]);
  x9[48] = _mm256_add_epi32(x8[48], x8[49]);
  x9[49] = _mm256_sub_epi32(x8[48], x8[49]);
  x9[50] = _mm256_sub_epi32(x8[51], x8[50]);
  x9[51] = _mm256_add_epi32(x8[51], x8[50]);
  x9[52] = _mm256_add_epi32(x8[52], x8[53]);
  x9[53] = _mm256_sub_epi32(x8[52], x8[53]);
  x9[54] = _mm256_sub_epi32(x8[55], x8[54]);
  x9[55] = _mm256_add_epi32(x8[55], x8[54]);
  x9[56] = _mm256_add_epi32(x8[56], x8[57]);
  x9[57] = _mm256_sub_epi32(x8[56], x8[57]);
  x9[58] = _mm256_sub_epi32(x8[59], x8[58]);
  x9[59] = _mm256_add_epi32(x8[59], x8[58]);
  x9[60] = _mm256_add_epi32(x8[60], x8[61]);
  x9[61] = _mm256_sub_epi32(x8[60], x8[61]);
  x9[62] = _mm256_sub_epi32(x8[63], x8[62]);
  x9[63] = _mm256_add_epi32(x8[63], x8[62]);
}